

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void check_analyze(string *str,bool has8bit,bool utf8,bool utf16)

{
  ostream *poVar1;
  bool is_utf16;
  bool is_valid_utf8;
  bool has_8bit_chars;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  local_29 = false;
  local_2a = false;
  local_2b = false;
  QUtil::analyze_encoding(str,&local_29,&local_2a,&local_2b);
  if (((local_29 != has8bit) || (local_2a != utf8)) || (local_2b != utf16)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"analysis failed: ");
    poVar1 = std::operator<<(poVar1,(string *)str);
    poVar1 = std::operator<<(poVar1,": 8bit: ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,", utf8: ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,", utf16: ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void
check_analyze(std::string const& str, bool has8bit, bool utf8, bool utf16)
{
    bool has_8bit_chars = false;
    bool is_valid_utf8 = false;
    bool is_utf16 = false;
    QUtil::analyze_encoding(str, has_8bit_chars, is_valid_utf8, is_utf16);
    if (!((has_8bit_chars == has8bit) && (is_valid_utf8 == utf8) && (is_utf16 == utf16))) {
        std::cout << "analysis failed: " << str << ": 8bit: " << has_8bit_chars
                  << ", utf8: " << is_valid_utf8 << ", utf16: " << is_utf16 << std::endl;
    }
}